

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

int dlep_extension_radio_write_destination
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar4;
  undefined1 local_bb [3];
  int result;
  oonf_layer2_neigh_key_str nbuf;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_neigh_key *neigh_local;
  dlep_session *session_local;
  dlep_extension *ext_local;
  undefined4 local_30;
  uint local_2c;
  undefined *local_28;
  undefined4 local_20;
  uint local_1c;
  undefined *local_18;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  l2neigh = (oonf_layer2_neigh *)neigh;
  neigh_local = (oonf_layer2_neigh_key *)session;
  session_local = (dlep_session *)ext;
  nbuf._91_8_ = dlep_session_get_local_l2_neighbor(session,neigh);
  if ((oonf_layer2_neigh *)nbuf._91_8_ == (oonf_layer2_neigh *)0x0) {
    local_1c = *(uint *)(neigh_local[8].link_id + 5);
    local_18 = &log_global_mask;
    local_20 = 4;
    if (((&log_global_mask)[local_1c] & 4) != 0) {
      uVar4 = *(undefined4 *)(neigh_local[8].link_id + 5);
      uVar3 = oonf_layer2_neigh_key_to_string(local_bb,l2neigh,1);
      oonf_log(4,uVar4,"src/generic/dlep/dlep_extension.c",0x189,0,0,
               "Could not find l2neigh for neighbor %s",uVar3);
    }
    ext_local._4_4_ = -1;
  }
  else {
    ext_local._4_4_ =
         dlep_writer_map_l2neigh_data
                   ((dlep_writer *)(neigh_local[5].link_id + 6),(dlep_extension *)session_local,
                    ((oonf_layer2_neigh *)nbuf._91_8_)->data,
                    ((oonf_layer2_neigh *)nbuf._91_8_)->network->neighdata);
    if (ext_local._4_4_ == 0) {
      ext_local._4_4_ = 0;
    }
    else {
      local_2c = *(uint *)(neigh_local[8].link_id + 5);
      local_28 = &log_global_mask;
      local_30 = 4;
      if (((&log_global_mask)[local_2c] & 4) != 0) {
        uVar1 = *(undefined4 *)(neigh_local[8].link_id + 5);
        uVar2 = *(undefined4 *)&(session_local->cfg).peer_type;
        uVar3 = oonf_layer2_neigh_key_to_string(local_bb,l2neigh,1);
        oonf_log(4,uVar1,"src/generic/dlep/dlep_extension.c",0x191,0,0,
                 "tlv mapping for extension %d and neighbor %s failed: %d",CONCAT44(uVar4,uVar2),
                 uVar3,ext_local._4_4_);
      }
    }
  }
  return ext_local._4_4_;
}

Assistant:

int
dlep_extension_radio_write_destination(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh) {
  struct oonf_layer2_neigh *l2neigh;
  union oonf_layer2_neigh_key_str nbuf;
  int result;

  l2neigh = dlep_session_get_local_l2_neighbor(session, neigh);
  if (!l2neigh) {
    OONF_WARN(session->log_source,
      "Could not find l2neigh "
      "for neighbor %s",
      oonf_layer2_neigh_key_to_string(&nbuf, neigh, true));
    return -1;
  }

  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2neigh->data, l2neigh->network->neighdata);
  if (result) {
    OONF_WARN(session->log_source,
      "tlv mapping for extension %d and neighbor %s failed: %d",
      ext->id, oonf_layer2_neigh_key_to_string(&nbuf, neigh, true), result);
    return result;
  }
  return 0;
}